

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalTimeCoordinator.cpp
# Opt level: O0

void __thiscall
helics::GlobalTimeCoordinator::sendTimeUpdateRequest(GlobalTimeCoordinator *this,Time triggerTime)

{
  bool bVar1;
  iterator __args;
  reference this_00;
  ActionMessage *in_RDI;
  DependencyInfo *dep;
  iterator __end1;
  iterator __begin1;
  TimeDependencies *__range1;
  ActionMessage updateTime;
  TimeDependencies *in_stack_fffffffffffffee8;
  undefined8 in_stack_ffffffffffffff00;
  ActionMessage *in_stack_ffffffffffffff08;
  GlobalFederateId in_stack_ffffffffffffff10;
  GlobalFederateId in_stack_ffffffffffffff14;
  __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  local_e0;
  GlobalFederateId *local_d8;
  undefined4 local_d0;
  undefined4 local_cc;
  BaseType local_b8;
  undefined2 local_b0;
  TimeRepresentation<count_time<9,_long>_> local_8;
  
  local_cc = *(undefined4 *)((in_RDI->payload).buffer._M_elems + 8);
  local_d0 = *(undefined4 *)((in_RDI->payload).buffer._M_elems + 8);
  ActionMessage::ActionMessage
            (in_stack_ffffffffffffff08,(action_t)((ulong)in_stack_ffffffffffffff00 >> 0x20),
             in_stack_ffffffffffffff14,in_stack_ffffffffffffff10);
  local_b0 = *(undefined2 *)((in_RDI->payload).buffer._M_elems + 0xc);
  local_d8 = &in_RDI->source_id;
  local_e0._M_current = (DependencyInfo *)TimeDependencies::begin(in_stack_fffffffffffffee8);
  __args = TimeDependencies::end(in_stack_fffffffffffffee8);
  while (bVar1 = __gnu_cxx::
                 operator==<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                           ((__normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                             *)in_RDI,
                            (__normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                             *)__args._M_current), ((bVar1 ^ 0xffU) & 1) != 0) {
    this_00 = __gnu_cxx::
              __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
              ::operator*(&local_e0);
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<=
                      ((TimeRepresentation<count_time<9,_long>_> *)this_00,&local_8);
    if ((bVar1) &&
       (bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                          ((TimeRepresentation<count_time<9,_long>_> *)this_00,
                           (TimeRepresentation<count_time<9,_long>_> *)&cBigTime), bVar1)) {
      local_b8 = (this_00->fedID).gid;
      ActionMessage::setExtraDestData(in_RDI,(int32_t)((ulong)__args._M_current >> 0x20));
      this_00->updateRequested = true;
      (this_00->super_TimeData).grantedIteration =
           *(int32_t *)((in_RDI->payload).buffer._M_elems + 0xc);
      std::function<void_(const_helics::ActionMessage_&)>::operator()
                ((function<void_(const_helics::ActionMessage_&)> *)in_RDI,
                 (ActionMessage *)__args._M_current);
    }
    __gnu_cxx::
    __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
    ::operator++(&local_e0);
  }
  ActionMessage::~ActionMessage(in_RDI);
  return;
}

Assistant:

void GlobalTimeCoordinator::sendTimeUpdateRequest(Time triggerTime)
{
    ActionMessage updateTime(CMD_REQUEST_CURRENT_TIME, mSourceId, mSourceId);
    updateTime.counter = sequenceCounter;
    for (auto& dep : dependencies) {
        if (dep.next <= triggerTime && dep.next < cBigTime) {
            updateTime.dest_id = dep.fedID;
            updateTime.setExtraDestData(dep.sequenceCounter);
            dep.updateRequested = true;
            dep.grantedIteration = sequenceCounter;
            sendMessageFunction(updateTime);
        }
    }
}